

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O1

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationAnglesRadians
          (ON_AerialPhotoCameraPosition *this,double omega_radians,double phi_radians,
          double kappa_radians)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double xx;
  double d;
  double d_00;
  ON_3dVector axis;
  ON_3dVector axis_00;
  ON_3dVector axis_01;
  ON_3dPoint center;
  ON_3dPoint center_00;
  ON_3dPoint center_01;
  bool bVar4;
  double *pdVar5;
  long lVar6;
  int i;
  int i_00;
  ON_Xform *pOVar7;
  ON_Xform *pOVar8;
  int j;
  byte bVar9;
  ON_3dVector z3;
  ON_3dVector y2;
  ON_3dVector x1;
  ON_3dVector y3;
  ON_3dVector x3;
  ON_3dVector z0;
  ON_3dVector y0;
  ON_3dVector x0;
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  ON_Xform r1;
  ON_Xform r2;
  ON_3dVector r2r1z0;
  ON_3dVector r1y0;
  ON_3dVector x2;
  ON_3dVector z2;
  ON_3dVector z1;
  ON_3dVector y1;
  ON_Xform zero;
  ON_Xform r3;
  ON_Xform r321;
  ON_3dVector local_4e8;
  ON_3dVector local_4d0;
  ON_3dVector local_4b8;
  ON_3dVector local_498;
  ON_3dVector local_480;
  ON_3dVector local_468;
  ON_3dVector local_450;
  ON_3dVector local_438;
  ON_3dVector local_420;
  ON_3dVector local_408;
  ON_3dVector local_3f0;
  ON_3dVector local_3d8;
  ON_Xform local_3c0;
  ON_Xform local_340;
  ON_3dVector local_2c0;
  ON_3dVector local_2a8;
  ON_3dVector local_290;
  ON_3dVector local_278;
  ON_3dVector local_260;
  ON_3dVector local_248;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar9 = 0;
  bVar4 = ON_IsValid(omega_radians);
  if (((bVar4) && (bVar4 = ON_IsValid(phi_radians), bVar4)) &&
     (bVar4 = ON_IsValid(kappa_radians), bVar4)) {
    ON_3dVector::Set(&this->m_orientation_angles_radians,omega_radians,phi_radians,kappa_radians);
    ON_3dVector::Set(&this->m_orientation_angles_degrees,(omega_radians * 180.0) / 3.141592653589793
                     ,(phi_radians * 180.0) / 3.141592653589793,
                     (kappa_radians * 180.0) / 3.141592653589793);
    dVar1 = cos(omega_radians);
    dVar2 = sin(omega_radians);
    dVar3 = cos(phi_radians);
    xx = sin(phi_radians);
    d = cos(kappa_radians);
    d_00 = sin(kappa_radians);
    ON_3dVector::ON_3dVector
              (&local_3d8,dVar3 * d,d_00 * dVar1 + dVar2 * xx * d,d_00 * dVar2 - xx * d * dVar1);
    ON_3dVector::ON_3dVector
              (&local_3f0,-d_00 * dVar3,d * dVar1 - dVar2 * xx * d_00,d * dVar2 + xx * d_00 * dVar1)
    ;
    ON_3dVector::ON_3dVector(&local_408,xx,-dVar3 * dVar2,dVar1 * dVar3);
    ON_Xform::ON_Xform(&local_130);
    local_130.m_xform[0][0] = local_3d8.x;
    local_130.m_xform[0][1] = local_3f0.x;
    local_130.m_xform[0][2] = local_408.x;
    i_00 = 0;
    local_130.m_xform[0][3] = 0.0;
    local_130.m_xform[1][0] = local_3d8.y;
    local_130.m_xform[1][1] = local_3f0.y;
    local_130.m_xform[1][2] = local_408.y;
    local_130.m_xform[1][3] = 0.0;
    local_130.m_xform[2][0] = local_3d8.z;
    local_130.m_xform[2][1] = local_3f0.z;
    local_130.m_xform[2][2] = local_408.z;
    local_130.m_xform[3][1] = 0.0;
    local_130.m_xform[3][2] = 0.0;
    local_130.m_xform[2][3] = 0.0;
    local_130.m_xform[3][0] = 0.0;
    local_130.m_xform[3][3] = 1.0;
    pOVar7 = &local_130;
    pOVar8 = &this->m_orientation_rotation;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pOVar8->m_xform[0][0] = pOVar7->m_xform[0][0];
      pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      pOVar8 = (ON_Xform *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    (this->m_orientation_right).z = local_3d8.z;
    (this->m_orientation_right).x = local_3d8.x;
    (this->m_orientation_right).y = local_3d8.y;
    (this->m_orientation_up).x = local_3f0.x;
    (this->m_orientation_up).y = local_3f0.y;
    (this->m_orientation_up).z = local_3f0.z;
    ON_3dVector::operator-((ON_3dVector *)&local_3c0,&local_408);
    (this->m_orientation_direction).z = local_3c0.m_xform[0][2];
    (this->m_orientation_direction).x = local_3c0.m_xform[0][0];
    (this->m_orientation_direction).y = local_3c0.m_xform[0][1];
    this->m_status = this->m_status | 2;
    ON_3dVector::ON_3dVector(&local_420,1.0,0.0,0.0);
    ON_3dVector::ON_3dVector(&local_438,0.0,1.0,0.0);
    ON_3dVector::ON_3dVector(&local_450,0.0,0.0,1.0);
    local_498.z = local_420.z;
    local_498.x = local_420.x;
    local_498.y = local_420.y;
    ::operator*((ON_3dVector *)&local_3c0,dVar1,&local_438);
    ::operator*((ON_3dVector *)&local_340,dVar2,&local_450);
    ON_3dVector::operator+(&local_248,(ON_3dVector *)&local_3c0,(ON_3dVector *)&local_340);
    ::operator*((ON_3dVector *)&local_3c0,-dVar2,&local_438);
    ::operator*((ON_3dVector *)&local_340,dVar1,&local_450);
    ON_3dVector::operator+(&local_260,(ON_3dVector *)&local_3c0,(ON_3dVector *)&local_340);
    local_4b8.z = local_248.z;
    local_4b8.x = local_248.x;
    local_4b8.y = local_248.y;
    ::operator*((ON_3dVector *)&local_3c0,xx,&local_498);
    ::operator*((ON_3dVector *)&local_340,dVar3,&local_260);
    ON_3dVector::operator+(&local_278,(ON_3dVector *)&local_3c0,(ON_3dVector *)&local_340);
    ::operator*((ON_3dVector *)&local_3c0,dVar3,&local_498);
    ::operator*((ON_3dVector *)&local_340,xx,&local_260);
    ON_3dVector::operator-(&local_290,(ON_3dVector *)&local_3c0,(ON_3dVector *)&local_340);
    local_4e8.z = local_278.z;
    local_4e8.x = local_278.x;
    local_4e8.y = local_278.y;
    ::operator*((ON_3dVector *)&local_3c0,d,&local_290);
    ::operator*((ON_3dVector *)&local_340,d_00,&local_4b8);
    ON_3dVector::operator+(&local_468,(ON_3dVector *)&local_3c0,(ON_3dVector *)&local_340);
    ::operator*((ON_3dVector *)&local_3c0,-d_00,&local_290);
    ::operator*((ON_3dVector *)&local_340,d,&local_4b8);
    ON_3dVector::operator+(&local_480,(ON_3dVector *)&local_3c0,(ON_3dVector *)&local_340);
    ON_Xform::ON_Xform(&local_3c0);
    axis.y = local_420.y;
    axis.x = local_420.x;
    axis.z = local_420.z;
    center.y = ON_3dPoint::Origin.y;
    center.x = ON_3dPoint::Origin.x;
    center.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_3c0,omega_radians,axis,center);
    ON_Xform::operator*(&local_2a8,&local_3c0,&local_438);
    ON_Xform::ON_Xform(&local_340);
    axis_00.y = local_2a8.y;
    axis_00.x = local_2a8.x;
    axis_00.z = local_2a8.z;
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_340,phi_radians,axis_00,center_00);
    ON_Xform::operator*(&local_1b0,&local_340,&local_3c0);
    ON_Xform::operator*(&local_2c0,&local_1b0,&local_450);
    ON_Xform::ON_Xform(&local_1b0);
    axis_01.y = local_2c0.y;
    axis_01.x = local_2c0.x;
    axis_01.z = local_2c0.z;
    center_01.y = ON_3dPoint::Origin.y;
    center_01.x = ON_3dPoint::Origin.x;
    center_01.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_1b0,kappa_radians,axis_01,center_01);
    ON_Xform::operator*(&local_230,&local_1b0,&local_340);
    ON_Xform::operator*(&local_b0,&local_230,&local_3c0);
    ON_Xform::operator-(&local_230,&local_b0,&local_130);
    dVar1 = 0.0;
    do {
      lVar6 = 0;
      dVar2 = dVar1;
      do {
        pdVar5 = ON_Xform::operator[](&local_230,i_00);
        dVar1 = ABS(pdVar5[lVar6]);
        if (ABS(pdVar5[lVar6]) <= dVar2) {
          dVar1 = dVar2;
        }
        lVar6 = lVar6 + 1;
        dVar2 = dVar1;
      } while (lVar6 != 4);
      i_00 = i_00 + 1;
    } while (i_00 != 4);
    ON_3dVector::operator-(&local_4d0,&local_468,&local_3d8);
    dVar2 = ON_3dVector::MaximumCoordinate(&local_4d0);
    dVar3 = ABS(dVar2);
    if (ABS(dVar2) <= dVar1) {
      dVar3 = dVar1;
    }
    ON_3dVector::operator-(&local_4d0,&local_480,&local_3f0);
    dVar1 = ON_3dVector::MaximumCoordinate(&local_4d0);
    dVar2 = ABS(dVar1);
    if (ABS(dVar1) <= dVar3) {
      dVar2 = dVar3;
    }
    ON_3dVector::operator-(&local_4d0,&local_4e8,&local_408);
    dVar1 = ON_3dVector::MaximumCoordinate(&local_4d0);
    dVar3 = ABS(dVar1);
    if (ABS(dVar1) <= dVar2) {
      dVar3 = dVar2;
    }
    if (1e-15 < dVar3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_photogrammetry.cpp"
                 ,0x2d9,"","Transform trauma");
    }
    return true;
  }
  UnsetOrientation(this);
  return false;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationAnglesRadians(
    double omega_radians, 
    double phi_radians, 
    double kappa_radians
    )
{
  bool rc = false;

  if ( ON_IsValid(omega_radians) && ON_IsValid(phi_radians) && ON_IsValid(kappa_radians) )
  {
    m_orientation_angles_radians.Set(omega_radians,phi_radians,kappa_radians);
    m_orientation_angles_degrees.Set(omega_radians*180.0/ON_PI,phi_radians*180.0/ON_PI,kappa_radians*180.0/ON_PI);

    const double c1 = cos(omega_radians);
    const double s1 = sin(omega_radians);
  
    const double c2 = cos(phi_radians);
    const double s2 = sin(phi_radians);
  
    const double c3 = cos(kappa_radians);
    const double s3 = sin(kappa_radians);

    const ON_3dVector X( c3*c2,  s3*c1 + c3*s2*s1,  s3*s1 - c3*s2*c1);
    const ON_3dVector Y(-s3*c2,  c3*c1 - s3*s2*s1,  c3*s1 + s3*s2*c1);
    const ON_3dVector Z(    s2,            -c2*s1,             c2*c1);

    ON_Xform R;
    R.m_xform[0][0] = X.x; R.m_xform[0][1] = Y.x; R.m_xform[0][2] = Z.x; R.m_xform[0][3] = 0.0;
    R.m_xform[1][0] = X.y; R.m_xform[1][1] = Y.y; R.m_xform[1][2] = Z.y; R.m_xform[1][3] = 0.0;
    R.m_xform[2][0] = X.z; R.m_xform[2][1] = Y.z; R.m_xform[2][2] = Z.z; R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0; R.m_xform[3][1] = 0.0; R.m_xform[3][2] = 0.0; R.m_xform[3][3] = 1.0;

    m_orientation_rotation = R;

    m_orientation_right = X;
    m_orientation_up = Y;
    m_orientation_direction = -Z;

    m_status |= 2;

    rc = true;

    {
      // Debugging validation tests

      const ON_3dVector x0(1.0,0.0,0.0);
      const ON_3dVector y0(0.0,1.0,0.0);
      const ON_3dVector z0(0.0,0.0,1.0);

      const ON_3dVector x1 = x0;
      const ON_3dVector y1 =  c1*y0 + s1*z0;
      const ON_3dVector z1 = -s1*y0 + c1*z0;

      const ON_3dVector y2 = y1;
      const ON_3dVector z2 = s2*x1 + c2*z1;
      const ON_3dVector x2 = c2*x1 - s2*z1;

      const ON_3dVector z3 =  z2;
      const ON_3dVector x3 =  c3*x2 + s3*y2;
      const ON_3dVector y3 = -s3*x2 + c3*y2;

      /*
      const ON_3dVector x1 = x0;
      const ON_3dVector y1 = (0.0,  c1,  s1);
      const ON_3dVector z1 = (0.0, -s1,  c1);

      const ON_3dVector x2 = (c2,  s2*s1, -s2*c1); // c2*x1 - s2*z1;
      const ON_3dVector y2 = (0.0,    c1,     s1);
      const ON_3dVector z2 = (s2, -c2*s1,  c2*c1); // s2*x1 + c2*z1
      */


      ON_Xform r1;
      r1.Rotation(omega_radians,x0,ON_3dPoint::Origin);
      ON_3dVector r1y0 = r1*y0;

      ON_Xform r2;
      r2.Rotation(phi_radians,r1y0,ON_3dPoint::Origin);
      ON_3dVector r2r1z0 = r2*r1*z0;

      ON_Xform r3;
      r3.Rotation(kappa_radians,r2r1z0,ON_3dPoint::Origin);

      ON_Xform r321 = r3*r2*r1;


      ON_Xform zero = r321 - R;

      double a, b;
      double max_zero = 0.0;
      for ( int i = 0; i < 4; i++ ) for ( int j = 0; j < 4; j++ )
      {
        a = fabs(zero[i][j]);
        if (a > max_zero )
          max_zero = a;
      }
      b = fabs((x3-X).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;
      b = fabs((y3-Y).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;
      b = fabs((z3-Z).MaximumCoordinate());
      if ( b > max_zero )
        max_zero = b;


      if ( max_zero > 1.0e-15 )
        ON_ERROR("Transform trauma");
    }
  }
  else
  {
    UnsetOrientation();
  }

  return rc;
}